

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

PrecomputedTransactionData *
PrecomputePSBTData(PrecomputedTransactionData *__return_storage_ptr__,
                  PartiallySignedTransaction *psbt)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  vector<CTxOut,_std::allocator<CTxOut>_> utxos;
  vector<CTxOut,_std::allocator<CTxOut>_> local_68;
  vector<CTxOut,_std::allocator<CTxOut>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            (&local_50,
             ((long)*(pointer *)
                     ((long)&(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                             _M_payload.
                             super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                             super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                             vin + 8) -
              *(long *)&(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                        _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin >>
             3) * 0x4ec4ec4ec4ec4ec5,(allocator_type *)&local_68);
  if (*(pointer *)
       ((long)&(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) ==
      *(pointer *)
       &(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin) {
    memset(__return_storage_ptr__,0,0x102);
    (__return_storage_ptr__->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_spent_outputs).
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_spent_outputs).
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) = 0;
  }
  else {
    bVar2 = 1;
    lVar3 = 0;
    uVar4 = 0;
    do {
      bVar1 = PartiallySignedTransaction::GetInputUTXO
                        (psbt,(CTxOut *)
                              ((long)&(local_50.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->nValue + lVar3),
                         (int)uVar4);
      bVar2 = bVar2 & bVar1;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (ulong)(((long)*(pointer *)
                                     ((long)&(psbt->tx).
                                             super__Optional_base<CMutableTransaction,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                             .super__Optional_payload_base<CMutableTransaction>.
                                             _M_payload._M_value.vin + 8) -
                              *(long *)&(psbt->tx).
                                        super__Optional_base<CMutableTransaction,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                        .super__Optional_payload_base<CMutableTransaction>.
                                        _M_payload._M_value.vin >> 3) * 0x4ec4ec4ec4ec4ec5));
    memset(__return_storage_ptr__,0,0x102);
    (__return_storage_ptr__->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_spent_outputs).
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_spent_outputs).
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) = 0;
    if (bVar2 == 0) {
      local_68.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      PrecomputedTransactionData::Init<CMutableTransaction>
                (__return_storage_ptr__,(CMutableTransaction *)psbt,&local_68,true);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_68);
      goto LAB_0035ab78;
    }
  }
  PrecomputedTransactionData::Init<CMutableTransaction>
            (__return_storage_ptr__,(CMutableTransaction *)psbt,&local_50,true);
LAB_0035ab78:
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

PrecomputedTransactionData PrecomputePSBTData(const PartiallySignedTransaction& psbt)
{
    const CMutableTransaction& tx = *psbt.tx;
    bool have_all_spent_outputs = true;
    std::vector<CTxOut> utxos(tx.vin.size());
    for (size_t idx = 0; idx < tx.vin.size(); ++idx) {
        if (!psbt.GetInputUTXO(utxos[idx], idx)) have_all_spent_outputs = false;
    }
    PrecomputedTransactionData txdata;
    if (have_all_spent_outputs) {
        txdata.Init(tx, std::move(utxos), true);
    } else {
        txdata.Init(tx, {}, true);
    }
    return txdata;
}